

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O2

Mat * __thiscall
ncnn::ModelBin::load(Mat *__return_storage_ptr__,ModelBin *this,int w,int h,int type)

{
  Mat m;
  Mat local_68;
  
  (*this->_vptr_ModelBin[2])(&local_68,this,(ulong)(uint)(h * w),type);
  if ((local_68.data == (void *)0x0) || ((long)local_68.c * local_68.cstep == 0)) {
    Mat::Mat(__return_storage_ptr__,&local_68);
  }
  else {
    Mat::reshape(__return_storage_ptr__,&local_68,w,h,(Allocator *)0x0);
  }
  Mat::~Mat(&local_68);
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBin::load(int w, int h, int type) const
{
    Mat m = load(w * h, type);
    if (m.empty())
        return m;

    return m.reshape(w, h);
}